

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrixMatrix.h
# Opt level: O1

void Eigen::internal::
     triangular_product_impl<1,true,Eigen::Transpose<Eigen::Matrix<float,-1,-1,1,-1,-1>const>const,false,Eigen::Matrix<float,-1,-1,0,-1,-1>,false>
     ::run<Eigen::Matrix<float,_1,_1,0,_1,_1>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *a_lhs,
               Matrix<float,__1,__1,_0,__1,__1> *a_rhs,Scalar *alpha)

{
  non_const_type pMVar1;
  long _rows;
  long _cols;
  long _depth;
  Scalar actualAlpha;
  Matrix<float,__1,__1,_0,__1,__1> *local_80;
  BlockingType blocking;
  Index n;
  
  pMVar1 = a_lhs->m_matrix;
  actualAlpha = *alpha;
  _depth = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.
           m_rows;
  _rows = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_cols
  ;
  _cols = (a_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (_rows < _depth) {
    _depth = _rows;
  }
  blocking.super_level3_blocking<float,_float>.m_blockA = (LhsScalar *)0x0;
  blocking.super_level3_blocking<float,_float>.m_blockB = (RhsScalar *)0x0;
  local_80 = dst;
  blocking.super_level3_blocking<float,_float>.m_mc = _rows;
  blocking.super_level3_blocking<float,_float>.m_nc = _cols;
  blocking.super_level3_blocking<float,_float>.m_kc = _depth;
  n = _cols;
  evaluateProductBlockingSizesHeuristic<float,float,4,long>
            (&blocking.super_level3_blocking<float,_float>.m_kc,
             &blocking.super_level3_blocking<float,_float>.m_mc,&n,1);
  blocking.m_sizeA =
       blocking.super_level3_blocking<float,_float>.m_mc *
       blocking.super_level3_blocking<float,_float>.m_kc;
  blocking.m_sizeB =
       blocking.super_level3_blocking<float,_float>.m_kc *
       blocking.super_level3_blocking<float,_float>.m_nc;
  product_triangular_matrix_matrix<float,_long,_1,_true,_0,_false,_0,_false,_0,_1,_0>::run
            (_rows,_cols,_depth,
             (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.
             m_data,(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).
                    m_storage.m_cols,
             (a_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,(a_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                    m_storage.m_rows,
             (local_80->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
             m_data,1,(local_80->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows,&actualAlpha,&blocking.super_level3_blocking<float,_float>);
  free(blocking.super_level3_blocking<float,_float>.m_blockA);
  free(blocking.super_level3_blocking<float,_float>.m_blockB);
  return;
}

Assistant:

static void run(Dest& dst, const Lhs &a_lhs, const Rhs &a_rhs, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar  LhsScalar;
    typedef typename Rhs::Scalar  RhsScalar;
    typedef typename Dest::Scalar Scalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef typename internal::remove_all<ActualLhsType>::type ActualLhsTypeCleaned;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;
    
    typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(a_lhs);
    typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(a_rhs);

    LhsScalar lhs_alpha = LhsBlasTraits::extractScalarFactor(a_lhs);
    RhsScalar rhs_alpha = RhsBlasTraits::extractScalarFactor(a_rhs);
    Scalar actualAlpha = alpha * lhs_alpha * rhs_alpha;

    typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Lhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxColsAtCompileTime,4> BlockingType;

    enum { IsLower = (Mode&Lower) == Lower };
    Index stripedRows  = ((!LhsIsTriangular) || (IsLower))  ? lhs.rows() : (std::min)(lhs.rows(),lhs.cols());
    Index stripedCols  = ((LhsIsTriangular)  || (!IsLower)) ? rhs.cols() : (std::min)(rhs.cols(),rhs.rows());
    Index stripedDepth = LhsIsTriangular ? ((!IsLower) ? lhs.cols() : (std::min)(lhs.cols(),lhs.rows()))
                                         : ((IsLower)  ? rhs.rows() : (std::min)(rhs.rows(),rhs.cols()));

    BlockingType blocking(stripedRows, stripedCols, stripedDepth, 1, false);

    internal::product_triangular_matrix_matrix<Scalar, Index,
      Mode, LhsIsTriangular,
      (internal::traits<ActualLhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, LhsBlasTraits::NeedToConjugate,
      (internal::traits<ActualRhsTypeCleaned>::Flags&RowMajorBit) ? RowMajor : ColMajor, RhsBlasTraits::NeedToConjugate,
      (internal::traits<Dest          >::Flags&RowMajorBit) ? RowMajor : ColMajor, Dest::InnerStrideAtCompileTime>
      ::run(
        stripedRows, stripedCols, stripedDepth,   // sizes
        &lhs.coeffRef(0,0), lhs.outerStride(),    // lhs info
        &rhs.coeffRef(0,0), rhs.outerStride(),    // rhs info
        &dst.coeffRef(0,0), dst.innerStride(), dst.outerStride(),    // result info
        actualAlpha, blocking
      );

    // Apply correction if the diagonal is unit and a scalar factor was nested:
    if ((Mode&UnitDiag)==UnitDiag)
    {
      if (LhsIsTriangular && lhs_alpha!=LhsScalar(1))
      {
        Index diagSize = (std::min)(lhs.rows(),lhs.cols());
        dst.topRows(diagSize) -= ((lhs_alpha-LhsScalar(1))*a_rhs).topRows(diagSize);
      }
      else if ((!LhsIsTriangular) && rhs_alpha!=RhsScalar(1))
      {
        Index diagSize = (std::min)(rhs.rows(),rhs.cols());
        dst.leftCols(diagSize) -= (rhs_alpha-RhsScalar(1))*a_lhs.leftCols(diagSize);
      }
    }
  }